

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O0

int32_t __thiscall
VersionBitsCache::ComputeBlockVersion(VersionBitsCache *this,CBlockIndex *pindexPrev,Params *params)

{
  long lVar1;
  ThresholdState TVar2;
  uint32_t uVar3;
  int iVar4;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  ThresholdState state;
  DeploymentPos pos;
  int i;
  int32_t nVersion;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  Mutex *in_stack_ffffffffffffff78;
  DeploymentPos in_stack_ffffffffffffff86;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined2 in_stack_ffffffffffffffb6;
  undefined2 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffba;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,
                      CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8)),
             (AnnotatedMixin<std::mutex> *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  uVar5 = 0x20000000;
  for (iVar4 = 0; iVar4 < 2; iVar4 = iVar4 + 1) {
    anon_unknown.dwarf_aa81fe::VersionBitsConditionChecker::VersionBitsConditionChecker
              ((VersionBitsConditionChecker *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff86);
    TVar2 = AbstractThresholdConditionChecker::GetStateFor
                      ((AbstractThresholdConditionChecker *)pindexPrev,
                       (CBlockIndex *)criticalblock3.super_unique_lock._8_8_,params,_i);
    if ((TVar2 == LOCKED_IN) || (TVar2 == STARTED)) {
      uVar3 = Mask((Params *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffff86);
      uVar5 = uVar3 | uVar5;
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

int32_t VersionBitsCache::ComputeBlockVersion(const CBlockIndex* pindexPrev, const Consensus::Params& params)
{
    LOCK(m_mutex);
    int32_t nVersion = VERSIONBITS_TOP_BITS;

    for (int i = 0; i < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; i++) {
        Consensus::DeploymentPos pos = static_cast<Consensus::DeploymentPos>(i);
        ThresholdState state = VersionBitsConditionChecker(pos).GetStateFor(pindexPrev, params, m_caches[pos]);
        if (state == ThresholdState::LOCKED_IN || state == ThresholdState::STARTED) {
            nVersion |= Mask(params, pos);
        }
    }

    return nVersion;
}